

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

float Abc_NtkComputeNodeLoad(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = Bus_SclObjLoad(pObj);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    fVar2 = Abc_SclFindWireLoad(p->vWireCaps,(pObj->vFanouts).nSize);
    for (lVar1 = 0; lVar1 < (pObj->vFanouts).nSize; lVar1 = lVar1 + 1) {
      fVar3 = Bus_SclObjCin((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]]);
      fVar2 = fVar2 + fVar3;
    }
    Bus_SclObjSetLoad(pObj,fVar2);
    return fVar2;
  }
  __assert_fail("Bus_SclObjLoad(pObj) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                ,0xd8,"float Abc_NtkComputeNodeLoad(Bus_Man_t *, Abc_Obj_t *)");
}

Assistant:

float Abc_NtkComputeNodeLoad( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    assert( Bus_SclObjLoad(pObj) == 0 );
    Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    Bus_SclObjSetLoad( pObj, Load );
    return Load;
}